

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t is_nfs4_perms_w(wchar_t *start,wchar_t *end,wchar_t *permset)

{
  wchar_t *pwVar1;
  wchar_t *local_30;
  wchar_t *p;
  wchar_t *permset_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  local_30 = start;
  while (local_30 < end) {
    pwVar1 = local_30 + 1;
    switch(*local_30) {
    case L'-':
      local_30 = pwVar1;
      break;
    default:
      return L'\0';
    case L'A':
      *permset = *permset | 0x400;
      local_30 = pwVar1;
      break;
    case L'C':
      *permset = *permset | 0x2000;
      local_30 = pwVar1;
      break;
    case L'D':
      *permset = *permset | 0x100;
      local_30 = pwVar1;
      break;
    case L'R':
      *permset = *permset | 0x40;
      local_30 = pwVar1;
      break;
    case L'W':
      *permset = *permset | 0x80;
      local_30 = pwVar1;
      break;
    case L'a':
      *permset = *permset | 0x200;
      local_30 = pwVar1;
      break;
    case L'c':
      *permset = *permset | 0x1000;
      local_30 = pwVar1;
      break;
    case L'd':
      *permset = *permset | 0x800;
      local_30 = pwVar1;
      break;
    case L'o':
      *permset = *permset | 0x4000;
      local_30 = pwVar1;
      break;
    case L'p':
      *permset = *permset | 0x20;
      local_30 = pwVar1;
      break;
    case L'r':
      *permset = *permset | 8;
      local_30 = pwVar1;
      break;
    case L's':
      *permset = *permset | 0x8000;
      local_30 = pwVar1;
      break;
    case L'w':
      *permset = *permset | 0x10;
      local_30 = pwVar1;
      break;
    case L'x':
      *permset = *permset | 1;
      local_30 = pwVar1;
    }
  }
  return L'\x01';
}

Assistant:

static int
is_nfs4_perms_w(const wchar_t *start, const wchar_t *end, int *permset)
{
	const wchar_t *p = start;

	while (p < end) {
		switch (*p++) {
		case L'r':
			*permset |= ARCHIVE_ENTRY_ACL_READ_DATA;
			break;
		case L'w':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_DATA;
			break;
		case L'x':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case L'p':
			*permset |= ARCHIVE_ENTRY_ACL_APPEND_DATA;
			break;
		case L'D':
			*permset |= ARCHIVE_ENTRY_ACL_DELETE_CHILD;
			break;
		case L'd':
			*permset |= ARCHIVE_ENTRY_ACL_DELETE;
			break;
		case L'a':
			*permset |= ARCHIVE_ENTRY_ACL_READ_ATTRIBUTES;
			break;
		case L'A':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_ATTRIBUTES;
			break;
		case L'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ_NAMED_ATTRS;
			break;
		case L'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_NAMED_ATTRS;
			break;
		case L'c':
			*permset |= ARCHIVE_ENTRY_ACL_READ_ACL;
			break;
		case L'C':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_ACL;
			break;
		case L'o':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE_OWNER;
			break;
		case L's':
			*permset |= ARCHIVE_ENTRY_ACL_SYNCHRONIZE;
			break;
		case L'-':
			break;
		default:
			return(0);
		}
	}
	return (1);
}